

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O3

void DepParserTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  search *this;
  uint uVar7;
  vw *pvVar8;
  undefined8 *__s;
  typed_option<unsigned_long> *op;
  typed_option<unsigned_int> *ptVar9;
  example *this_00;
  undefined **ppuVar10;
  char **ppcVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  byte bVar13;
  char *pair [19];
  char *triple [12];
  option_group_definition new_options;
  allocator_type local_2a1;
  search *local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  undefined1 local_278 [112];
  bool local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  char *local_1b8 [2];
  char local_1a8 [80];
  option_group_definition local_158;
  bool *local_120;
  options_i *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  bVar13 = 0;
  pvVar8 = Search::search::get_vw_pointer_unsafe(sch);
  __s = (undefined8 *)operator_new(0x2c8);
  memset(__s,0,0x2c8);
  v_array<unsigned_int>::resize((v_array<unsigned_int> *)(__s + 7),5);
  *__s = 0;
  sch->task_data = __s;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Dependency Parser Options","");
  local_158.m_name._M_dataplus._M_p = (pointer)&local_158.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_50,local_50 + local_48);
  local_158.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = options;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"root_label","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_278,&local_70,__s + 1);
  local_208 = true;
  op = VW::config::typed_option<unsigned_long>::default_value
                 ((typed_option<unsigned_long> *)local_278,8);
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"Ensure that there is only one root in each sentence","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>(&local_158,op);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  local_278._0_8_ = &PTR__typed_option_002eb060;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"num_label","");
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_278,&local_90,(uint *)(__s + 2));
  local_208 = true;
  ptVar9 = VW::config::typed_option<unsigned_int>::default_value
                     ((typed_option<unsigned_int> *)local_278,0xc);
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Number of arc labels","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_158,ptVar9);
  local_2a0 = sch;
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  local_278._0_8_ = &PTR__typed_option_002eb0d0;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"transition_system","");
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_278,&local_b0,(uint *)((long)__s + 0x2c4));
  local_208 = true;
  ptVar9 = VW::config::typed_option<unsigned_int>::default_value
                     ((typed_option<unsigned_int> *)local_278,1);
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"1: arc-hybrid 2: arc-eager","");
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (&local_158,ptVar9);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  local_278._0_8_ = &PTR__typed_option_002eb0d0;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"one_learner","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_278,&local_d0,(bool *)((long)__s + 0x2c2));
  local_208 = true;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"Using one learner instead of three learners for labeled parser",""
            );
  std::__cxx11::string::_M_assign((string *)(local_278 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_158,(typed_option<bool> *)local_278);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  local_278._0_8_ = &PTR__typed_option_002eaf88;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"cost_to_go","");
  local_120 = (bool *)((long)__s + 0x2c1);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_278,&local_f0,local_120);
  local_208 = true;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,
             "Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out","");
  std::__cxx11::string::_M_assign((string *)(local_278 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_158,(typed_option<bool> *)local_278);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  local_278._0_8_ = &PTR__typed_option_002eaf88;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"old_style_labels","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_278,&local_110,(bool *)(__s + 0x58));
  local_208 = true;
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"Use old hack of label information","");
  std::__cxx11::string::_M_assign((string *)(local_278 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_158,(typed_option<bool> *)local_278);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  local_278._0_8_ = &PTR__typed_option_002eaf88;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  (**local_118->_vptr_options_i)(local_118,&local_158);
  this_00 = VW::alloc_examples(0x28,1);
  *__s = this_00;
  local_278[0] = 100;
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this_00,local_278);
  lVar12 = -0xd;
  do {
    local_278[0] = (char)lVar12 + 'O';
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)*__s,local_278);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0);
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)*__s,&constant_namespace);
  Search::search::set_num_learners(local_2a0,(ulong)(*(bool *)((long)__s + 0x2c2) ^ 1) * 2 + 1);
  memcpy(local_278,&PTR_anon_var_dwarf_8fbc6c_002ee950,0x98);
  ppuVar10 = &PTR_anon_var_dwarf_8fbd36_002ee9f0;
  ppcVar11 = local_1b8;
  for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
    *ppcVar11 = *ppuVar10;
    ppuVar10 = ppuVar10 + (ulong)bVar13 * -2 + 1;
    ppcVar11 = ppcVar11 + (ulong)bVar13 * -2 + 1;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8,
             (char **)local_278,(char **)&local_1e0,(allocator_type *)&local_298);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
             local_1b8,(char **)&local_158,&local_2a1);
  pbVar1 = (pvVar8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar8->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar3 = (pvVar8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (pvVar8->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pvVar8->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pvVar8->pairs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (pvVar8->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pvVar8->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_298.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar5 = (pvVar8->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (pvVar8->triples).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pvVar8->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_298.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pvVar8->triples).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_298.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = &pvVar8->interactions;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar5;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar3;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_01);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (pvVar8->interactions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pvVar8->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pvVar8->pairs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (pvVar8->interactions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (pvVar8->triples).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (pvVar8->triples).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this = local_2a0;
  uVar7 = 0;
  if (*local_120 != false) {
    uVar7 = Search::ACTION_COSTS;
  }
  Search::search::set_options
            (local_2a0,Search::NO_CACHING | Search::AUTO_CONDITION_FEATURES | uVar7);
  Search::search::set_label_parser
            (this,(label_parser *)&COST_SENSITIVE::cs_label,
             initialize::anon_class_1_0_00000001::__invoke);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_158.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158.m_name._M_dataplus._M_p != &local_158.m_name.field_2) {
    operator_delete(local_158.m_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void initialize(Search::search &sch, size_t & /*num_actions*/, options_i &options)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = new task_data();
  data->action_loss.resize(5);
  data->ex = NULL;
  sch.set_task_data<task_data>(data);

  option_group_definition new_options("Dependency Parser Options");
  new_options.add(make_option("root_label", data->root_label)
                      .keep()
                      .default_value(8)
                      .help("Ensure that there is only one root in each sentence"));
  new_options.add(make_option("num_label", data->num_label).keep().default_value(12).help("Number of arc labels"));
  new_options.add(make_option("transition_system", data->transition_system)
                      .keep()
                      .default_value(1)
                      .help("1: arc-hybrid 2: arc-eager"));
  new_options.add(make_option("one_learner", data->one_learner)
                      .keep()
                      .help("Using one learner instead of three learners for labeled parser"));
  new_options.add(make_option("cost_to_go", data->cost_to_go)
                      .keep()
                      .help("Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out"));
  new_options.add(
      make_option("old_style_labels", data->old_style_labels).keep().help("Use old hack of label information"));
  options.add_and_parse(new_options);

  data->ex = VW::alloc_examples(sizeof(polylabel), 1);
  data->ex->indices.push_back(val_namespace);
  for (size_t i = 1; i < 14; i++) data->ex->indices.push_back((unsigned char)i + 'A');
  data->ex->indices.push_back(constant_namespace);

  if (data->one_learner)
    sch.set_num_learners(1);
  else
    sch.set_num_learners(3);

  const char *pair[] = {
      "BC", "BE", "BB", "CC", "DD", "EE", "FF", "GG", "EF", "BH", "BJ", "EL", "dB", "dC", "dD", "dE", "dF", "dG", "dd"};
  const char *triple[] = {"EFG", "BEF", "BCE", "BCD", "BEL", "ELM", "BHI", "BCC", "BEJ", "BEH", "BJK", "BEN"};
  vector<string> newpairs(pair, pair + 19);
  vector<string> newtriples(triple, triple + 12);
  all.pairs.swap(newpairs);
  all.triples.swap(newtriples);

  all.interactions.clear();
  all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
  all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
  if (data->cost_to_go)
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING | ACTION_COSTS);
  else
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING);

  sch.set_label_parser(COST_SENSITIVE::cs_label, [](polylabel &l) -> bool { return l.cs.costs.size() == 0; });
}